

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InsideExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,SourceRange *args_3)

{
  SourceRange sourceRange;
  InsideExpression *this_00;
  Type *in_RDX;
  Expression *in_RSI;
  SourceLocation in_R8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  SourceLocation in_stack_ffffffffffffffd0;
  
  this_00 = (InsideExpression *)
            allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (size_t)in_stack_ffffffffffffff98);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RSI,
             in_stack_ffffffffffffff98);
  sourceRange.endLoc = in_R8;
  sourceRange.startLoc = in_stack_ffffffffffffffd0;
  ast::InsideExpression::InsideExpression
            (this_00,in_RDX,in_RSI,
             *(span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_R8,sourceRange
            );
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }